

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkSort.c
# Opt level: O0

void dup_needed_pipes(int pipeAmount,int (*pipes) [2],int neededReadPipe,int neededWritePipe)

{
  int iVar1;
  int local_24;
  int i;
  int neededWritePipe_local;
  int neededReadPipe_local;
  int (*pipes_local) [2];
  int pipeAmount_local;
  
  local_24 = 0;
  do {
    if (pipeAmount <= local_24) {
      return;
    }
    if (local_24 == neededReadPipe) {
      iVar1 = dup2(pipes[local_24][1],1);
      if (iVar1 == -1) {
        fprintf(_stderr,"%s ERROR: dup-Error\n",fileName);
        exit(1);
      }
    }
    else if ((local_24 == neededWritePipe) && (iVar1 = dup2(pipes[local_24][0],0), iVar1 == -1)) {
      fprintf(_stderr,"%s ERROR: dup-Error\n",fileName);
      exit(1);
    }
    close(pipes[local_24][1]);
    close(pipes[local_24][0]);
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static void dup_needed_pipes(int pipeAmount, int pipes[pipeAmount][2], int neededReadPipe, int neededWritePipe)
{
	for (int i = 0; i < pipeAmount; i++)
	{

		if (i == neededReadPipe)
		{
			if (dup2(pipes[i][1], STDOUT_FILENO) == -1)
			{
				ERROR_EXIT("dup-Error");
			}
		}
		else if (i == neededWritePipe)
		{
			if (dup2(pipes[i][0], STDIN_FILENO) == -1)
			{
				ERROR_EXIT("dup-Error");
			}
		}

		close(pipes[i][1]);
		close(pipes[i][0]);
	}
}